

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O2

void __thiscall dh::scanner::debug(scanner *this)

{
  TYPE TVar1;
  ostream *poVar2;
  pointer this_00;
  string tmp_type;
  string local_50;
  
  if (this->scanflag != false) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[INFO] Token Sries: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"[INFO] Size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (this_00 = (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl
                   .super__Vector_impl_data._M_start;
        this_00 !=
        (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
        super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      tmp_type._M_dataplus._M_p = (pointer)&tmp_type.field_2;
      tmp_type._M_string_length = 0;
      tmp_type.field_2._M_local_buf[0] = '\0';
      TVar1 = token::getType(this_00);
      if ((TVar1 - BOOLEAN < 0x18) && ((0xfdffffU >> (TVar1 - BOOLEAN & 0x1f) & 1) != 0)) {
        std::__cxx11::string::assign((char *)&tmp_type);
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"{\t");
      token::getVal_abi_cxx11_(&local_50,this_00);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,",\t");
      poVar2 = std::operator<<(poVar2,(string *)&tmp_type);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&tmp_type);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"[INFO] Token End");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"[ERROR] Token Sequence is not ready\n");
  return;
}

Assistant:

void scanner::debug()
{
	if ( !scanflag)
	{
		::std::cerr << "[ERROR] Token Sequence is not ready\n";
		return;
	}

	::std::cout << "[INFO] Token Sries: " << ::std::endl;
	::std::cout << "[INFO] Size: " << _tokens.size() << ::std::endl;

	for(auto i = _tokens.begin(); i != _tokens.end(); ++i)
	{
		::std::string tmp_type;
		switch(i->getType())
		{
			case TYPE::BOOLEAN:
				tmp_type = "BOOLEAN";
				break;
			case TYPE::BREAK:
				tmp_type = "BREAK";
				break;
			case TYPE::CONTINUE:
				tmp_type = "CONTINUE";
				break;
			case TYPE::ELSE:
				tmp_type = "ELSE";
				break;
			case TYPE::FOR:
				tmp_type = "FOR";
				break;
			case TYPE::FLOAT:
				tmp_type = "FLOAT";
				break;
			case TYPE::IF:
				tmp_type = "IF";
				break;
			case TYPE::INT:
				tmp_type = "INT";
				break;
			case TYPE::RETURN:
				tmp_type = "RETURN";
				break;
			case TYPE::VOID:
				tmp_type = "VOID";
				break;
			case TYPE::WHILE:
				tmp_type = "WHILE";
				break;
			case TYPE::ADDOP:
				tmp_type = "ADDOP";
				break;
			case TYPE::MULOP:
				tmp_type = "MULOP";
				break;
			case TYPE::RELOP:
				tmp_type = "RELOP";
				break;
			case TYPE::EQUOP:
				tmp_type = "EQUOP";
				break;
			case TYPE::LOGICALOP:
				tmp_type = "LOGICALOP";
				break;
			case TYPE::ASSINGOP:
				tmp_type = "ASSINGOP";
				break;
			case TYPE::ID:
				tmp_type = "ID";
				break;
			case TYPE::SEPOP:
				tmp_type = "SEPOP";
				break;
			case TYPE::STRING:
				tmp_type = "STRING";
				break;
			case TYPE::NUMINT:
				tmp_type = "NUMINT";
				break;
			case TYPE::NUMFLOAT:
				tmp_type = "NUMFLOAT";
				break;
			case TYPE::NUMBOOLEAN:
				tmp_type = "NUMBOOLEAN";
			case TYPE::NONES:
				break;
		}
		::std::cout << "{\t" << i->getVal() << ",\t" << tmp_type << ::std::endl;
	}

	::std::cout << "[INFO] Token End" << ::std::endl;
}